

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildBrInt2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,int32 relativeOffset,
          RegSlot src1,RegSlot src2)

{
  ValueType VVar1;
  RegSlot srcRegSlot;
  RegSlot srcRegSlot_00;
  RegOpnd *src1Opnd;
  RegOpnd *this_00;
  
  srcRegSlot = GetRegSlotFromTypedReg(this,src1,INT32);
  srcRegSlot_00 = GetRegSlotFromTypedReg(this,src2,INT32);
  src1Opnd = BuildSrcOpnd(this,srcRegSlot,TyInt32);
  VVar1 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&src1Opnd->super_Opnd,VVar1);
  this_00 = BuildSrcOpnd(this,srcRegSlot_00,TyInt32);
  VVar1 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar1);
  BuildBrCmp(this,newOpcode,offset,relativeOffset,src1Opnd,&this_00->super_Opnd);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildBrInt2(Js::OpCodeAsmJs newOpcode, uint32 offset, int32 relativeOffset, Js::RegSlot src1, Js::RegSlot src2)
{
    Js::RegSlot src1RegSlot = GetRegSlotFromIntReg(src1);
    Js::RegSlot src2RegSlot = GetRegSlotFromIntReg(src2);

    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TyInt32);
    src1Opnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TyInt32);
    src2Opnd->SetValueType(ValueType::GetInt(false));

    BuildBrCmp(newOpcode, offset, relativeOffset, src1Opnd, src2Opnd);
}